

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_tlbsync(DisasContext_conflict10 *ctx)

{
  if (ctx->gtse == true) {
    if (ctx->pr == false) {
LAB_009f6f17:
      if ((ctx->insns_flags & 0x10000000000000) != 0) {
        gen_check_tlb_flush(ctx,true);
        return;
      }
      return;
    }
  }
  else if ((ctx->pr == false) && (ctx->hv != false)) goto LAB_009f6f17;
  gen_priv_exception(ctx,1);
  return;
}

Assistant:

static void gen_tlbsync(DisasContext *ctx)
{
    if (ctx->gtse) {
        CHK_SV; /* If gtse is set then tlbsync is supervisor privileged */
    } else {
        CHK_HV; /* Else hypervisor privileged */
    }

    /* BookS does both ptesync and tlbsync make tlbsync a nop for server */
    if (ctx->insns_flags & PPC_BOOKE) {
        gen_check_tlb_flush(ctx, true);
    }
}